

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O1

void exprnode_dump(BinarySink *bs,ExprNode *en,char *origtext)

{
  Operator OVar1;
  void *pvVar2;
  BinarySink *bs_00;
  ExprNode **__s;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pl_02;
  
  pvVar2 = (en->text).ptr;
  BinarySink_put_fmt(bs->binarysink_,"(%zu:%zu ",(long)pvVar2 - (long)origtext,
                     (long)pvVar2 + ((en->text).len - (long)origtext));
  OVar1 = en->op;
  switch(OVar1) {
  case OP_AND:
  case OP_OR:
    pcVar4 = "or";
    if (OVar1 == OP_AND) {
      pcVar4 = "and";
    }
    pl.len = (ulong)(OVar1 == OP_AND) | 2;
    pl.ptr = pcVar4;
    BinarySink_put_datapl(bs->binarysink_,pl);
    if ((en->field_2).field_0.nsubexprs != 0) {
      uVar5 = 0;
      do {
        BinarySink_put_byte(bs->binarysink_,' ');
        exprnode_dump(bs,(en->field_2).field_0.subexprs[uVar5],origtext);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (en->field_2).field_0.nsubexprs);
    }
    break;
  case OP_NOT:
    pl_00.len = 4;
    pl_00.ptr = "not ";
    BinarySink_put_datapl(bs->binarysink_,pl_00);
    exprnode_dump(bs,(ExprNode *)(en->field_2).field_0.subexprs,origtext);
    break;
  case OP_HOSTNAME_WC:
    pl_01.len = 9;
    pl_01.ptr = "host-wc \'";
    BinarySink_put_datapl(bs->binarysink_,pl_01);
    bs_00 = bs->binarysink_;
    __s = (en->field_2).field_0.subexprs;
    sVar3 = strlen((char *)__s);
    pl_02.len = sVar3;
    pl_02.ptr = __s;
    BinarySink_put_datapl(bs_00,pl_02);
    BinarySink_put_byte(bs->binarysink_,'\'');
    break;
  case OP_PORT_RANGE:
    BinarySink_put_fmt(bs->binarysink_,"port-range %u %u",(ulong)(en->field_2).field_3.lo,
                       (ulong)(en->field_2).field_3.hi);
    break;
  default:
    __assert_fail("false && \"unhandled node type in exprnode_dump\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                  ,0x2c2,"void exprnode_dump(BinarySink *, ExprNode *, const char *)");
  }
  BinarySink_put_byte(bs->binarysink_,')');
  return;
}

Assistant:

static void exprnode_dump(BinarySink *bs, ExprNode *en, const char *origtext)
{
    put_fmt(bs, "(%zu:%zu ",
            (size_t)((const char *)en->text.ptr - origtext),
            (size_t)((const char *)ptrlen_end(en->text) - origtext));
    switch (en->op) {
      case OP_AND:
      case OP_OR:
        put_dataz(bs, en->op == OP_AND ? "and" : "or");
        for (size_t i = 0; i < en->nsubexprs; i++) {
            put_byte(bs, ' ');
            exprnode_dump(bs, en->subexprs[i], origtext);
        }
        break;
      case OP_NOT:
        put_dataz(bs, "not ");
        exprnode_dump(bs, en->subexpr, origtext);
        break;
      case OP_HOSTNAME_WC:
        put_dataz(bs, "host-wc '");
        put_dataz(bs, en->wc);
        put_byte(bs, '\'');
        break;
      case OP_PORT_RANGE:
        put_fmt(bs, "port-range %u %u", en->lo, en->hi);
        break;
      default:
        unreachable("unhandled node type in exprnode_dump");
    }
    put_byte(bs, ')');
}